

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O3

void litroom(boolean on,obj *obj)

{
  char cVar1;
  permonst *ppVar2;
  bool bVar3;
  boolean bVar4;
  char *pcVar5;
  level *plVar6;
  uint uVar7;
  char *pcVar8;
  undefined1 *puVar9;
  int iVar10;
  int iVar11;
  obj *poVar12;
  char is_lit;
  undefined1 local_31;
  
  if (on == '\0') {
    poVar12 = invent;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0023103f;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00231036;
LAB_00231123:
      if ((u._1052_1_ & 1) != 0) {
        pline("It seems even darker in here than before.");
        return;
      }
      if (((uwep == (obj *)0x0) || (bVar4 = artifact_light(uwep), bVar4 == '\0')) ||
         ((uwep->field_0x4c & 8) == 0)) {
        pline("You are surrounded by darkness!");
        poVar12 = invent;
      }
      else {
        pcVar5 = xname(uwep);
        pcVar5 = the(pcVar5);
        pline("Suddenly, the only light left comes from %s!",pcVar5);
        poVar12 = invent;
      }
    }
    else {
LAB_00231036:
      if (ublindf != (obj *)0x0) {
LAB_0023103f:
        if (ublindf->oartifact == '\x1d') goto LAB_00231123;
      }
    }
    for (; poVar12 != (obj *)0x0; poVar12 = poVar12->nobj) {
      if ((poVar12->field_0x4c & 8) != 0) {
        snuff_lit(poVar12);
      }
    }
  }
  else if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00231026;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00231021;
LAB_0023106c:
    if ((u._1052_1_ & 1) != 0) {
      ppVar2 = (u.ustuck)->data;
      if ((ppVar2->mflags1 & 0x40000) != 0) {
        pcVar5 = Monnam(u.ustuck);
        pcVar5 = s_suffix(pcVar5);
        pcVar8 = mbodypart(u.ustuck,0x12);
        pline("%s %s is lit.",pcVar5,pcVar8);
        return;
      }
      cVar1 = ppVar2->mlet;
      pcVar5 = Monnam(u.ustuck);
      if (ppVar2 == mons + 0x9f || cVar1 == '\x16') {
        pcVar8 = "%s shines briefly.";
      }
      else {
        pcVar8 = "%s glistens.";
      }
      pline(pcVar8,pcVar5);
      return;
    }
    pline("A lit field surrounds you!");
  }
  else {
LAB_00231021:
    if (ublindf != (obj *)0x0) {
LAB_00231026:
      if (ublindf->oartifact == '\x1d') goto LAB_0023106c;
    }
  }
  if ((u._1052_1_ & 2) != 0) {
    return;
  }
  bVar4 = on_level(&u.uz,&dungeon_topology.d_water_level);
  if (bVar4 != '\0') {
    return;
  }
  if (uball != (obj *)0x0 && on == '\0') {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002310ee;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002310e5;
LAB_00231270:
      move_bc(1,0,uball->ox,uball->oy,uchain->ox,uchain->oy);
    }
    else {
LAB_002310e5:
      if (ublindf != (obj *)0x0) {
LAB_002310ee:
        if (ublindf->oartifact == '\x1d') goto LAB_00231270;
      }
    }
  }
  bVar4 = on_level(&u.uz,&dungeon_topology.d_rogue_level);
  if (bVar4 == '\0') {
    iVar11 = 5;
    if ((obj != (obj *)0x0) && (obj->oclass == '\t')) {
      iVar11 = (uint)((obj->field_0x4a & 2) >> 1) * 4 + 5;
    }
    puVar9 = &local_31;
    if (on == '\0') {
      puVar9 = (undefined1 *)0x0;
    }
    do_clear_area((int)u.ux,(int)u.uy,iVar11,set_lit,puVar9);
  }
  else {
    uVar7 = *(ushort *)&level->locations[u.ux][u.uy].field_0x8 & 0x3f;
    if (2 < uVar7) {
      uVar7 = uVar7 - 3;
      iVar11 = level->rooms[uVar7].lx + -1;
      plVar6 = level;
      if (iVar11 <= level->rooms[uVar7].hx + 1) {
        puVar9 = &local_31;
        if (on == '\0') {
          puVar9 = (undefined1 *)0x0;
        }
        do {
          iVar10 = (int)plVar6->rooms[uVar7].ly;
          if (iVar10 + -1 <= plVar6->rooms[uVar7].hy + 1) {
            iVar10 = iVar10 + -2;
            do {
              iVar10 = iVar10 + 1;
              set_lit(iVar11,iVar10,puVar9);
              plVar6 = level;
            } while (iVar10 <= level->rooms[uVar7].hy);
          }
          bVar3 = iVar11 <= plVar6->rooms[uVar7].hx;
          iVar11 = iVar11 + 1;
        } while (bVar3);
      }
      plVar6->rooms[uVar7].rlit = on;
    }
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
      if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_00231405;
      goto LAB_002313da;
    }
  }
  else {
LAB_002313da:
    if (ublindf == (obj *)0x0) {
      vision_full_recalc = '\x01';
      return;
    }
  }
  if (ublindf->oartifact != '\x1d') {
    vision_full_recalc = '\x01';
    return;
  }
LAB_00231405:
  vision_recalc(2);
  if (uball != (obj *)0x0 && on == '\0') {
    move_bc(0,0,uball->ox,uball->oy,uchain->ox,uchain->oy);
  }
  vision_full_recalc = '\x01';
  return;
}

Assistant:

void litroom(boolean on, struct obj *obj)
{
	char is_lit;	/* value is irrelevant; we use its address
			   as a `not null' flag for set_lit() */

	/* first produce the text (provided you're not blind) */
	if (!on) {
		struct obj *otmp;

		if (!Blind) {
		    if (u.uswallow) {
			pline("It seems even darker in here than before.");
			return;
		    }
		    if (uwep && artifact_light(uwep) && uwep->lamplit)
			pline("Suddenly, the only light left comes from %s!",
				the(xname(uwep)));
		    else
			pline("You are surrounded by darkness!");
		}

		/* the magic douses lamps, et al, too */
		for (otmp = invent; otmp; otmp = otmp->nobj)
		    if (otmp->lamplit)
			snuff_lit(otmp);
		if (Blind) goto do_it;
	} else {
		if (Blind) goto do_it;
		if (u.uswallow){
			if (is_animal(u.ustuck->data))
				pline("%s %s is lit.",
				        s_suffix(Monnam(u.ustuck)),
					mbodypart(u.ustuck, STOMACH));
			else
				if (is_whirly(u.ustuck->data))
					pline("%s shines briefly.",
					      Monnam(u.ustuck));
				else
					pline("%s glistens.", Monnam(u.ustuck));
			return;
		}
		pline("A lit field surrounds you!");
	}

do_it:
	/* No-op in water - can only see the adjacent squares and that's it! */
	if (Underwater || Is_waterlevel(&u.uz)) return;
	/*
	 *  If we are darkening the room and the hero is punished but not
	 *  blind, then we have to pick up and replace the ball and chain so
	 *  that we don't remember them if they are out of sight.
	 */
	if (Punished && !on && !Blind)
	    move_bc(1, 0, uball->ox, uball->oy, uchain->ox, uchain->oy);

	if (Is_rogue_level(&u.uz)) {
	    /* Can't use do_clear_area because MAX_RADIUS is too small */
	    /* rogue lighting must light the entire room */
	    int rnum = level->locations[u.ux][u.uy].roomno - ROOMOFFSET;
	    int rx, ry;
	    if (rnum >= 0) {
		for (rx = level->rooms[rnum].lx-1; rx <= level->rooms[rnum].hx+1; rx++)
		    for (ry = level->rooms[rnum].ly-1; ry <= level->rooms[rnum].hy+1; ry++)
			set_lit(rx, ry,
				(on ? &is_lit : NULL));
		level->rooms[rnum].rlit = on;
	    }
	    /* hallways remain dark on the rogue level */
	} else
	    do_clear_area(u.ux,u.uy,
		(obj && obj->oclass==SCROLL_CLASS && obj->blessed) ? 9 : 5,
		set_lit, (on ? &is_lit : NULL));

	/*
	 *  If we are not blind, then force a redraw on all positions in sight
	 *  by temporarily blinding the hero.  The vision recalculation will
	 *  correctly update all previously seen positions *and* correctly
	 *  set the waslit bit [could be messed up from above].
	 */
	if (!Blind) {
	    vision_recalc(2);

	    /* replace ball&chain */
	    if (Punished && !on)
		move_bc(0, 0, uball->ox, uball->oy, uchain->ox, uchain->oy);
	}

	vision_full_recalc = 1;	/* delayed vision recalculation */
}